

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrcFont.cpp
# Opt level: O2

size_t __thiscall
GrcFont::AutoPseudos
          (GrcFont *this,vector<unsigned_int,_std::allocator<unsigned_int>_> *vnUnicode,
          vector<unsigned_short,_std::allocator<unsigned_short>_> *vwGlyphID)

{
  pointer puVar1;
  GdlObject *extraout_RDX;
  iterator __end1;
  iterator __begin1;
  pointer puVar2;
  utf16 wchGlyph;
  uint nUnicode;
  utf16 local_3e;
  uint local_3c;
  pointer local_38;
  
  puVar1 = (this->m_vnCollisions).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  puVar2 = (this->m_vnCollisions).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  local_38 = puVar2;
  for (; puVar2 != puVar1; puVar2 = puVar2 + 1) {
    local_3c = *puVar2;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(vnUnicode,&local_3c);
    local_3e = GlyphFromCmap(this,local_3c,extraout_RDX);
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::push_back(vwGlyphID,&local_3e);
  }
  return (long)puVar1 - (long)local_38 >> 2;
}

Assistant:

size_t GrcFont::AutoPseudos(std::vector<unsigned int> & vnUnicode, std::vector<utf16> & vwGlyphID)
{
#ifdef _DEBUG
	if (m_fDebug)
		return 0;
#endif

	Assert(m_pFile); // insure Init() called
	Assert(m_nMaxGlyfId != -1); // insure ScanGlyfIds() called
	Assert(m_pCmap_3_10 || m_pCmap_3_1);
	
	// Fill the vectors with Unicode values that have duplicate glyph IDs and with the
	// glyph IDs that parallel the Unicode values.
	auto nSize = m_vnCollisions.size();
	for (auto const collision: m_vnCollisions)
	{
		unsigned int nUnicode = collision;
		vnUnicode.push_back(nUnicode);
		utf16 wchGlyph = GlyphFromCmap(nUnicode, NULL);
		vwGlyphID.push_back(wchGlyph);
	}
	return nSize;
}